

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall
txpackage_tests::package_submission_tests::test_method(package_submission_tests *this)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  bool bVar2;
  undefined1 uVar3;
  undefined1 expect_valid;
  unsigned_long uVar4;
  const_reference pvVar5;
  PackageMempoolAcceptResult *result;
  lazy_ostream *plVar6;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe278;
  CKey *pCVar7;
  char *this_00;
  char *in_stack_ffffffffffffe280;
  CMutableTransaction *pCVar8;
  char *this_01;
  char *in_stack_ffffffffffffe288;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *pvVar9;
  char *this_02;
  COutPoint *in_stack_ffffffffffffe290;
  undefined4 in_stack_ffffffffffffe298;
  int in_stack_ffffffffffffe29c;
  CMutableTransaction *in_stack_ffffffffffffe2a0;
  CMutableTransaction *in_stack_ffffffffffffe2a8;
  const_string *in_stack_ffffffffffffe2b0;
  CTxMemPool *pCVar10;
  undefined7 in_stack_ffffffffffffe2b8;
  undefined1 in_stack_ffffffffffffe2bf;
  iterator in_stack_ffffffffffffe2c0;
  size_type in_stack_ffffffffffffe2c8;
  optional<CFeeRate> *in_stack_ffffffffffffe2e8;
  Package *in_stack_ffffffffffffe2f0;
  CTxMemPool *in_stack_ffffffffffffe2f8;
  Chainstate *in_stack_ffffffffffffe300;
  undefined8 in_stack_ffffffffffffe370;
  undefined1 test_accept;
  CTxMemPool *in_stack_ffffffffffffe3c8;
  undefined1 in_stack_ffffffffffffe3d7;
  PackageMempoolAcceptResult *in_stack_ffffffffffffe3d8;
  undefined7 in_stack_ffffffffffffe3e0;
  undefined1 in_stack_ffffffffffffe3e7;
  undefined8 in_stack_ffffffffffffe408;
  CKey *in_stack_ffffffffffffe410;
  undefined8 in_stack_ffffffffffffe418;
  CTransactionRef *in_stack_ffffffffffffe420;
  TestChain100Setup *in_stack_ffffffffffffe428;
  CScript *in_stack_ffffffffffffe5b0;
  CAmount in_stack_ffffffffffffe5b8;
  undefined1 *local_1900;
  size_t i;
  package_submission_tests *this_local;
  CMutableTransaction *local_1748;
  undefined1 local_1740 [16];
  undefined1 local_1730 [64];
  const_string local_16f0 [2];
  lazy_ostream local_16d0 [2];
  assertion_result local_16b0 [2];
  const_string local_1678 [2];
  lazy_ostream local_1658 [2];
  assertion_result local_1638 [2];
  const_iterator it_child_deduped;
  const_iterator it_parent_deduped;
  const_string local_15f0;
  lazy_ostream local_15e0 [2];
  assertion_result local_15c0 [2];
  unsigned_long local_1588;
  undefined1 local_1580 [16];
  undefined1 local_1570 [64];
  undefined1 local_1530 [16];
  undefined1 local_1520 [68];
  ValidationState<PackageValidationResult> local_14dc;
  const_string local_1480 [2];
  lazy_ostream local_1460 [2];
  undefined8 local_1440;
  assertion_result local_1430 [2];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [68];
  ValidationState<PackageValidationResult> local_13a4;
  const_string local_1348 [2];
  lazy_ostream local_1328 [2];
  undefined8 local_1308;
  assertion_result local_12f8 [2];
  const_string local_12c0 [2];
  lazy_ostream local_12a0 [2];
  assertion_result local_1280 [2];
  const_string local_1248 [2];
  lazy_ostream local_1228 [2];
  _Base_ptr local_1208;
  assertion_result local_1200 [2];
  const_iterator it_child_1;
  const_iterator it_parent_1;
  ValidationState<PackageValidationResult> local_11b8;
  const_string local_1158 [3];
  lazy_ostream local_1128 [2];
  assertion_result local_1108 [2];
  unsigned_long local_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [64];
  undefined1 local_1078 [16];
  undefined1 local_1068 [64];
  ValidationState<PackageValidationResult> local_1028;
  const_string local_fd0 [2];
  lazy_ostream local_fb0 [2];
  assertion_result local_f90 [3];
  Package package_missing_parent;
  ValidationState<PackageValidationResult> local_f30;
  undefined1 local_ed8 [16];
  undefined1 local_ec8 [64];
  ValidationState<PackageValidationResult> local_e88;
  undefined1 local_e30 [16];
  undefined1 local_e20 [64];
  ValidationState<PackageValidationResult> local_de0;
  iterator it_child;
  iterator it_parent;
  const_string local_d78;
  lazy_ostream local_d68 [2];
  assertion_result local_d48 [2];
  Package package_invalid_parent;
  CTransactionRef tx_parent_invalid;
  CMutableTransaction mtx_parent_invalid;
  CScriptWitness bad_witness;
  unsigned_long local_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [64];
  undefined1 local_c30 [16];
  undefined1 local_c20 [64];
  ValidationState<PackageValidationResult> local_be0;
  const_string local_b88 [2];
  lazy_ostream local_b68 [2];
  assertion_result local_b48 [2];
  CTransactionRef tx_grandchild;
  CMutableTransaction mtx_grandchild;
  CKey grandchild_key;
  CTransactionRef tx_child;
  CMutableTransaction mtx_child;
  CKey child_key;
  CTransactionRef tx_parent;
  CMutableTransaction mtx_parent;
  Package package_3gen;
  Package package_parent_child;
  unsigned_long local_988;
  undefined1 local_980 [16];
  undefined1 local_970 [64];
  undefined1 local_930 [16];
  undefined1 local_920 [64];
  ValidationState<PackageValidationResult> local_8e0;
  const_string local_888 [2];
  lazy_ostream local_868 [2];
  assertion_result local_848 [4];
  CMutableTransaction mtx;
  Package package_unrelated;
  CKey parent_key;
  uint expected_pool_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_deduped;
  PackageMempoolAcceptResult submit_deduped;
  PackageMempoolAcceptResult submit_parent_child;
  undefined1 local_5d0 [32];
  PackageMempoolAcceptResult result_missing_parent;
  undefined1 local_510 [32];
  undefined1 local_4f0 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_parent_invalid;
  PackageMempoolAcceptResult result_quit_early;
  undefined1 local_430 [32];
  undefined1 local_410 [32];
  PackageMempoolAcceptResult result_3gen_submit;
  CTransaction local_378;
  CScript grandchild_locking_script;
  CKey local_290 [12];
  CScript child_locking_script;
  CKey local_1a8 [2];
  undefined1 local_188 [32];
  PackageMempoolAcceptResult result_unrelated_submit;
  ValidationState<PackageValidationResult> local_f0 [2];
  CScript parent_locking_script;
  
  local_1028.m_debug_message._M_dataplus._M_p = (pointer)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe278);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe2b0,
             (char *)in_stack_ffffffffffffe2a8,(char *)in_stack_ffffffffffffe2a0,
             in_stack_ffffffffffffe29c,SUB41((uint)in_stack_ffffffffffffe298 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffe278);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffe288);
  expected_pool_size = (uint)uVar4;
  GenerateRandomKey(SUB81((ulong)in_stack_ffffffffffffe280 >> 0x38,0));
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffe2a0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffe290,(CPubKey *)in_stack_ffffffffffffe288);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe288,(PKHash *)in_stack_ffffffffffffe280);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe278);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe278);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffe278);
  for (i = 0; i < 10; i = i + 1) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffe288,(size_type)in_stack_ffffffffffffe280);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe278,
               (shared_ptr<const_CTransaction> *)0xb6ba59);
    CKey::CKey((CKey *)in_stack_ffffffffffffe2a8,(CKey *)in_stack_ffffffffffffe2a0);
    CScript::CScript((CScript *)in_stack_ffffffffffffe278,(CScript *)0xb6ba8c);
    in_stack_ffffffffffffe280 = &DAT_124101100;
    in_stack_ffffffffffffe278 = (char *)local_f0;
    in_stack_ffffffffffffe288 = (char *)((ulong)in_stack_ffffffffffffe288 & 0xffffffff00000000);
    TestChain100Setup::CreateValidMempoolTransaction
              (in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,
               (uint32_t)((ulong)in_stack_ffffffffffffe418 >> 0x20),(int)in_stack_ffffffffffffe418,
               in_stack_ffffffffffffe410,in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8,
               SUB81((ulong)in_stack_ffffffffffffe408 >> 0x38,0));
    CScript::~CScript((CScript *)in_stack_ffffffffffffe278);
    CKey::~CKey((CKey *)in_stack_ffffffffffffe278);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe278);
    MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_ffffffffffffe280);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)CONCAT44(in_stack_ffffffffffffe29c,in_stack_ffffffffffffe298),
               (shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe290);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe278);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe278);
  }
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffe278);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe288);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffe288);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)in_stack_ffffffffffffe278);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    SUB81((ulong)in_stack_ffffffffffffe370 >> 0x38,0),in_stack_ffffffffffffe2e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe278);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    ValidationState<PackageValidationResult>::IsInvalid
              ((ValidationState<PackageValidationResult> *)in_stack_ffffffffffffe278);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe288,
               SUB81((ulong)in_stack_ffffffffffffe280 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe280,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    in_stack_ffffffffffffe278 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_868,local_888,0x175,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe278);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe278);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe280,(char (*) [1])in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    local_8e0.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)in_stack_ffffffffffffe278);
    local_8e0.m_mode = M_INVALID;
    in_stack_ffffffffffffe288 = "PackageValidationResult::PCKG_POLICY";
    in_stack_ffffffffffffe280 = (char *)&local_8e0;
    in_stack_ffffffffffffe278 = "result_unrelated_submit.m_state.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_8e0.m_reject_reason.field_2,&local_8e0.m_reject_reason,0x176,1,2,
               &local_8e0.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe278);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe280,(char (*) [1])in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)in_stack_ffffffffffffe280);
    in_stack_ffffffffffffe288 = "\"package-not-child-with-parents\"";
    in_stack_ffffffffffffe280 = "package-not-child-with-parents";
    in_stack_ffffffffffffe278 = "result_unrelated_submit.m_state.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
              (local_920,local_930,0x177,1,2,local_188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe278);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe278);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe280,(char (*) [1])in_stack_ffffffffffffe278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,
               (unsigned_long)in_stack_ffffffffffffe278);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffe278
              );
    local_988 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffe288);
    in_stack_ffffffffffffe288 = "expected_pool_size";
    in_stack_ffffffffffffe280 = (char *)&expected_pool_size;
    in_stack_ffffffffffffe278 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_970,local_980,0x178,1,2,&local_988);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe278);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe408 >> 0x38);
  } while (bVar2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffe278);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffe278);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffe288,(size_type)in_stack_ffffffffffffe280);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe278,
             (shared_ptr<const_CTransaction> *)0xb6c2b9);
  CKey::CKey((CKey *)in_stack_ffffffffffffe2a8,(CKey *)in_stack_ffffffffffffe2a0);
  CScript::CScript((CScript *)in_stack_ffffffffffffe278,(CScript *)0xb6c2ec);
  pCVar8 = (CMutableTransaction *)&DAT_124101100;
  pCVar7 = local_1a8;
  pvVar9 = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            *)((ulong)in_stack_ffffffffffffe288 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,
             (uint32_t)((ulong)in_stack_ffffffffffffe418 >> 0x20),(int)in_stack_ffffffffffffe418,
             in_stack_ffffffffffffe410,in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8,
             (bool)uVar3);
  CScript::~CScript((CScript *)pCVar7);
  CKey::~CKey(pCVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar7);
  MakeTransactionRef<CMutableTransaction&>(pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pvVar9,(value_type *)pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pvVar9,(value_type *)pCVar8);
  GenerateRandomKey(SUB81((ulong)pCVar8 >> 0x38,0));
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffe2a0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffe290,(CPubKey *)pvVar9);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(pvVar9,(PKHash *)pCVar8);
  GetScriptForDestination((CTxDestination *)pCVar7);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pCVar7);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar7,(shared_ptr<const_CTransaction> *)0xb6c448);
  CKey::CKey((CKey *)in_stack_ffffffffffffe2a8,(CKey *)in_stack_ffffffffffffe2a0);
  CScript::CScript((CScript *)pCVar7,(CScript *)0xb6c474);
  pCVar8 = (CMutableTransaction *)&DAT_11e1a3000;
  pCVar7 = local_290;
  pvVar9 = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            *)((ulong)pvVar9 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,
             (uint32_t)((ulong)in_stack_ffffffffffffe418 >> 0x20),(int)in_stack_ffffffffffffe418,
             in_stack_ffffffffffffe410,in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8,
             (bool)uVar3);
  CScript::~CScript((CScript *)pCVar7);
  CKey::~CKey(pCVar7);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)pCVar7);
  MakeTransactionRef<CMutableTransaction&>(pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pvVar9,(value_type *)pCVar8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)pvVar9,(value_type *)pCVar8);
  GenerateRandomKey(SUB81((ulong)pCVar8 >> 0x38,0));
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffe2a0);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffe290,(CPubKey *)pvVar9);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(pvVar9,(PKHash *)pCVar8);
  GetScriptForDestination((CTxDestination *)pCVar7);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)pCVar7);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)pCVar7,(shared_ptr<const_CTransaction> *)0xb6c5d2);
  CKey::CKey((CKey *)in_stack_ffffffffffffe2a8,(CKey *)in_stack_ffffffffffffe2a0);
  CScript::CScript((CScript *)pCVar7,(CScript *)0xb6c5fe);
  this_01 = &DAT_118244f00;
  this_00 = (char *)&local_378;
  this_02 = (char *)((ulong)pvVar9 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,
             (uint32_t)((ulong)in_stack_ffffffffffffe418 >> 0x20),(int)in_stack_ffffffffffffe418,
             in_stack_ffffffffffffe410,in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8,
             (bool)uVar3);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey((CKey *)this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_02,(value_type *)this_01);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_00);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    SUB81((ulong)in_stack_ffffffffffffe370 >> 0x38,0),in_stack_ffffffffffffe2e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    ValidationState<PackageValidationResult>::IsInvalid
              ((ValidationState<PackageValidationResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b48,local_b68,local_b88,0x19c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    local_be0.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)this_00);
    local_be0.m_mode = M_INVALID;
    this_02 = "PackageValidationResult::PCKG_POLICY";
    this_01 = (char *)&local_be0;
    this_00 = "result_3gen_submit.m_state.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_be0.m_reject_reason.field_2,&local_be0.m_reject_reason,0x19d,1,2,
               &local_be0.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)this_01);
    this_02 = "\"package-not-child-with-parents\"";
    this_01 = "package-not-child-with-parents";
    this_00 = "result_3gen_submit.m_state.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
              (local_c20,local_c30,0x19e,1,2,local_410);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
    local_c88 = CTxMemPool::size((CTxMemPool *)this_02);
    this_02 = "expected_pool_size";
    this_01 = (char *)&expected_pool_size;
    this_00 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_c70,local_c80,0x19f,1,2,&local_c88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  CScriptWitness::CScriptWitness((CScriptWitness *)this_00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe29c,in_stack_ffffffffffffe298),
                      (int *)in_stack_ffffffffffffe290);
  CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)this_02,(size_type)this_01);
  CScriptWitness::operator=((CScriptWitness *)this_02,(CScriptWitness *)this_01);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb6cd41);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb6cd56);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_00);
  __l._M_len = in_stack_ffffffffffffe2c8;
  __l._M_array = in_stack_ffffffffffffe2c0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),__l,
           (allocator_type *)in_stack_ffffffffffffe2b0);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_00);
  local_1900 = local_410;
  do {
    local_1900 = local_1900 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  } while (local_1900 != local_430);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_00);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    SUB81((ulong)in_stack_ffffffffffffe370 >> 0x38,0),in_stack_ffffffffffffe2e8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8,(bool)in_stack_ffffffffffffe3d7,in_stack_ffffffffffffe3c8);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_02);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      this_00 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_d48,local_d68,&local_d78,0x1ae,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    CTransaction::GetWitnessHash((CTransaction *)this_00);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)this_00);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    CTransaction::GetWitnessHash((CTransaction *)this_00);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
    it_child = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)this_01,(key_type *)this_00);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
      local_de0.m_result =
           ValidationState<TxValidationResult>::GetResult
                     ((ValidationState<TxValidationResult> *)this_00);
      local_de0.m_mode = 7;
      this_02 = "TxValidationResult::TX_WITNESS_MUTATED";
      this_01 = (char *)&local_de0;
      this_00 = "it_parent->second.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (&local_de0.m_reject_reason.field_2,&local_de0.m_reject_reason,0x1b2,1,2,
                 &local_de0.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<TxValidationResult> *)this_01);
      this_02 = "\"bad-witness-nonstandard\"";
      this_01 = "bad-witness-nonstandard";
      this_00 = "it_parent->second.m_state.GetRejectReason()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
                (local_e20,local_e30,0x1b3,1,2,local_4f0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
      local_e88.m_result =
           ValidationState<TxValidationResult>::GetResult
                     ((ValidationState<TxValidationResult> *)this_00);
      local_e88.m_mode = 5;
      this_02 = "TxValidationResult::TX_MISSING_INPUTS";
      this_01 = (char *)&local_e88;
      this_00 = "it_child->second.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
                (&local_e88.m_reject_reason.field_2,&local_e88.m_reject_reason,0x1b4,1,2,
                 &local_e88.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<TxValidationResult> *)this_01);
      this_02 = "\"bad-txns-inputs-missingorspent\"";
      this_01 = "bad-txns-inputs-missingorspent";
      this_00 = "it_child->second.m_state.GetRejectReason()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[31]>
                (local_ec8,local_ed8,0x1b5,1,2,local_510);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    local_f30.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)this_00);
    local_f30.m_mode = M_ERROR;
    this_02 = "PackageValidationResult::PCKG_TX";
    this_01 = (char *)&local_f30;
    this_00 = "result_quit_early.m_state.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_f30.m_reject_reason.field_2,&local_f30.m_reject_reason,0x1b7,1,2,
               &local_f30.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_00);
  CScriptWitness::~CScriptWitness((CScriptWitness *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)this_02,(size_type)this_01);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  CTransaction::GetHash((CTransaction *)this_00);
  COutPoint::COutPoint((COutPoint *)this_02,(Txid *)this_01,(uint32_t)((ulong)this_00 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffe29c,in_stack_ffffffffffffe298),in_stack_ffffffffffffe290
            );
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_02,(value_type *)this_01);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)this_00,(value_type *)0xb6e023);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_00);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    SUB81((ulong)in_stack_ffffffffffffe370 >> 0x38,0),in_stack_ffffffffffffe2e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    ValidationState<PackageValidationResult>::IsInvalid
              ((ValidationState<PackageValidationResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f90,local_fb0,local_fd0,0x1c2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    local_1028.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)this_00);
    local_1028.m_mode = M_INVALID;
    this_02 = "PackageValidationResult::PCKG_POLICY";
    this_01 = (char *)&local_1028;
    this_00 = "result_missing_parent.m_state.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_1028.m_reject_reason.field_2,&local_1028.m_reject_reason,0x1c3,1,2,
               &local_1028.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)this_01);
    this_02 = "\"package-not-child-with-unconfirmed-parents\"";
    this_01 = "package-not-child-with-unconfirmed-parents";
    this_00 = "result_missing_parent.m_state.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[43]>
              (local_1068,local_1078,0x1c4,1,2,local_5d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
    local_10d0 = CTxMemPool::size((CTxMemPool *)this_02);
    this_02 = "expected_pool_size";
    this_01 = (char *)&expected_pool_size;
    this_00 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_10b8,local_10c8,0x1c5,1,2,&local_10d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe370 >> 0x38);
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_00);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    (bool)uVar3,in_stack_ffffffffffffe2e8);
  expected_pool_size = expected_pool_size + 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    ValidationState<PackageValidationResult>::IsValid
              ((ValidationState<PackageValidationResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [41])this_00);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)this_01);
    boost::unit_test::operator<<
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]> *)
               this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1108,local_1128,local_1158,0x1ce,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>
                        *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    local_11b8.m_reject_reason._M_dataplus._M_p =
         (pointer)std::
                  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  ::size((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)this_00);
    local_11b8._0_8_ =
         std::
         vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)this_00);
    this_02 = "package_parent_child.size()";
    this_01 = (char *)&local_11b8;
    this_00 = "submit_parent_child.m_tx_results.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              ((undefined1 *)((long)&local_11b8.m_reject_reason.field_2 + 8),
               &local_11b8.m_reject_reason._M_string_length,0x1cf,1,2,&local_11b8.m_reject_reason);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  CTransaction::GetWitnessHash((CTransaction *)this_00);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *)this_01,(key_type *)this_00);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  CTransaction::GetWitnessHash((CTransaction *)this_00);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
  it_child_1 = std::
               map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)this_01,(key_type *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    local_1208 = (_Base_ptr)
                 std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::end((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)this_01);
    std::operator==((_Self *)this_02,(_Self *)this_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1200,local_1228,local_1248,0x1d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    ValidationState<TxValidationResult>::IsValid((ValidationState<TxValidationResult> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1280,local_12a0,local_12c0,0x1d3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    local_1308 = 100000000;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              this_02);
    GetVirtualTransactionSize((CTransaction *)this_00);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffe29c,in_stack_ffffffffffffe298),
                       (CAmount *)in_stack_ffffffffffffe290,(uint32_t)((ulong)this_02 >> 0x20));
    std::operator==((optional<CFeeRate> *)this_02,(CFeeRate *)this_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12f8,local_1328,local_1348,0x1d4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)this_02);
    local_13a4._4_8_ =
         std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
         size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               *)this_00);
    local_13a4.m_mode = M_INVALID;
    this_02 = "1";
    this_01 = (char *)&local_13a4;
    this_00 = "it_parent->second.m_wtxids_fee_calculations.value().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              ((undefined1 *)((long)&local_13a4.m_reject_reason.field_2 + 4),
               (undefined1 *)((long)&local_13a4.m_reject_reason._M_dataplus._M_p + 4),0x1d5,1,2,
               &local_13a4.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)this_02);
    pvVar5 = std::
             vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
             front((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)this_01);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    this_01 = (char *)CTransaction::GetWitnessHash((CTransaction *)this_00);
    this_02 = "tx_parent->GetWitnessHash()";
    this_00 = "it_parent->second.m_wtxids_fee_calculations.value().front()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (local_13e8,local_13f8,0x1d6,1,2,pvVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    local_1440 = 100000000;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              this_02);
    GetVirtualTransactionSize((CTransaction *)this_00);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffe29c,in_stack_ffffffffffffe298),
                       (CAmount *)in_stack_ffffffffffffe290,(uint32_t)((ulong)this_02 >> 0x20));
    uVar3 = std::operator==((optional<CFeeRate> *)this_02,(CFeeRate *)this_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
    result = (PackageMempoolAcceptResult *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1430,local_1460,local_1480,0x1d7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    expect_valid = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)expect_valid);
  do {
    pCVar10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)this_02);
    local_14dc._4_8_ =
         std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
         size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               *)this_00);
    local_14dc.m_mode = M_INVALID;
    this_02 = "1";
    this_01 = (char *)&local_14dc;
    this_00 = "it_child->second.m_wtxids_fee_calculations.value().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              ((undefined1 *)((long)&local_14dc.m_reject_reason.field_2 + 4),
               (undefined1 *)((long)&local_14dc.m_reject_reason._M_dataplus._M_p + 4),0x1d8,1,2,
               &local_14dc.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00);
    std::
    optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
    ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)this_02);
    pvVar5 = std::
             vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
             front((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)this_01);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    this_01 = (char *)CTransaction::GetWitnessHash((CTransaction *)this_00);
    this_02 = "tx_child->GetWitnessHash()";
    this_00 = "it_child->second.m_wtxids_fee_calculations.value().front()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (local_1520,local_1530,0x1d9,1,2,pvVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    test_accept = (undefined1)((ulong)plVar6 >> 0x38);
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
    local_1588 = CTxMemPool::size((CTxMemPool *)this_02);
    this_02 = "expected_pool_size";
    this_01 = (char *)&expected_pool_size;
    this_00 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1570,local_1580,0x1db,1,2,&local_1588);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_02);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_02);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_00);
  ProcessNewPackage(in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0,
                    (bool)test_accept,in_stack_ffffffffffffe2e8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)CONCAT17(uVar3,in_stack_ffffffffffffe3e0),result,(bool)expect_valid,pCVar10)
  ;
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_02);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      this_00 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_15c0,local_15e0,&local_15f0,0x1e3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    CTransaction::GetWitnessHash((CTransaction *)this_00);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)this_01,(key_type *)this_00);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    CTransaction::GetWitnessHash((CTransaction *)this_00);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_00);
    it_child_deduped =
         std::
         map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
         ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)this_01,(key_type *)this_00);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      this_00 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1638,local_1658,local_1678,0x1e7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b0,(size_t)in_stack_ffffffffffffe2a8,
                 (const_string *)in_stack_ffffffffffffe2a0);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_00)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_02,SUB81((ulong)this_01 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)this_01,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
      this_00 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_16b0,local_16d0,local_16f0,0x1e8,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      in_stack_ffffffffffffe2bf = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffe2bf);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  do {
    pCVar10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe2bf,in_stack_ffffffffffffe2b8),
               (const_string *)pCVar10,(size_t)in_stack_ffffffffffffe2a8,
               (const_string *)in_stack_ffffffffffffe2a0);
    in_stack_ffffffffffffe2a8 = (CMutableTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_01,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_02,this_01,(unsigned_long)this_00);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_00);
    in_stack_ffffffffffffe2a0 = (CMutableTransaction *)CTxMemPool::size((CTxMemPool *)this_02);
    this_02 = "expected_pool_size";
    this_01 = (char *)&expected_pool_size;
    this_00 = "m_node.mempool->size()";
    local_1748 = in_stack_ffffffffffffe2a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1730,local_1740,0x1eb,1,2,&local_1748);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_00);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey((CKey *)this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_00);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey((CKey *)this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_02);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey((CKey *)this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_submission_tests)
{
    LOCK(cs_main);
    unsigned int expected_pool_size = m_node.mempool->size();
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));

    // Unrelated transactions are not allowed in package submission.
    Package package_unrelated;
    for (size_t i{0}; i < 10; ++i) {
        auto mtx = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[i + 25], /*input_vout=*/0,
                                                 /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                 /*output_destination=*/parent_locking_script,
                                                 /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
        package_unrelated.emplace_back(MakeTransactionRef(mtx));
    }
    auto result_unrelated_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                     package_unrelated, /*test_accept=*/false, /*client_maxfeerate=*/{});
    // We don't expect m_tx_results for each transaction when basic sanity checks haven't passed.
    BOOST_CHECK(result_unrelated_submit.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(result_unrelated_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Parent and Child (and Grandchild) Package
    Package package_parent_child;
    Package package_3gen;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_parent_child.push_back(tx_parent);
    package_3gen.push_back(tx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_parent_child.push_back(tx_child);
    package_3gen.push_back(tx_child);

    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(PKHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/tx_child, /*input_vout=*/0,
                                                       /*input_height=*/101, /*input_signing_key=*/child_key,
                                                       /*output_destination=*/grandchild_locking_script,
                                                       /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef tx_grandchild = MakeTransactionRef(mtx_grandchild);
    package_3gen.push_back(tx_grandchild);

    // 3 Generations is not allowed.
    {
        auto result_3gen_submit = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                    package_3gen, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_3gen_submit.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_3gen_submit.m_state.GetRejectReason(), "package-not-child-with-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Parent and child package where transactions are invalid for reasons other than fee and
    // missing inputs, so the package validation isn't expected to happen.
    {
        CScriptWitness bad_witness;
        bad_witness.stack.emplace_back(1);
        CMutableTransaction mtx_parent_invalid{mtx_parent};
        mtx_parent_invalid.vin[0].scriptWitness = bad_witness;
        CTransactionRef tx_parent_invalid = MakeTransactionRef(mtx_parent_invalid);
        Package package_invalid_parent{tx_parent_invalid, tx_child};
        auto result_quit_early = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_invalid_parent, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_parent_invalid{CheckPackageMempoolAcceptResult(package_invalid_parent, result_quit_early, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_parent_invalid.value());
        } else {
            auto it_parent = result_quit_early.m_tx_results.find(tx_parent_invalid->GetWitnessHash());
            auto it_child = result_quit_early.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetResult(), TxValidationResult::TX_WITNESS_MUTATED);
            BOOST_CHECK_EQUAL(it_parent->second.m_state.GetRejectReason(), "bad-witness-nonstandard");
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetRejectReason(), "bad-txns-inputs-missingorspent");
        }
        BOOST_CHECK_EQUAL(result_quit_early.m_state.GetResult(), PackageValidationResult::PCKG_TX);
    }

    // Child with missing parent.
    mtx_child.vin.emplace_back(COutPoint(package_unrelated[0]->GetHash(), 0));
    Package package_missing_parent;
    package_missing_parent.push_back(tx_parent);
    package_missing_parent.push_back(MakeTransactionRef(mtx_child));
    {
        const auto result_missing_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                             package_missing_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        BOOST_CHECK(result_missing_parent.m_state.IsInvalid());
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(result_missing_parent.m_state.GetRejectReason(), "package-not-child-with-unconfirmed-parents");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Submit package with parent + child.
    {
        const auto submit_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        expected_pool_size += 2;
        BOOST_CHECK_MESSAGE(submit_parent_child.m_state.IsValid(),
                            "Package validation unexpectedly failed: " << submit_parent_child.m_state.GetRejectReason());
        BOOST_CHECK_EQUAL(submit_parent_child.m_tx_results.size(), package_parent_child.size());
        auto it_parent = submit_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = submit_parent_child.m_tx_results.find(tx_child->GetWitnessHash());
        BOOST_CHECK(it_parent != submit_parent_child.m_tx_results.end());
        BOOST_CHECK(it_parent->second.m_state.IsValid());
        BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_parent)));
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());
        BOOST_CHECK(it_child->second.m_effective_feerate == CFeeRate(1 * COIN, GetVirtualTransactionSize(*tx_child)));
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Already-in-mempool transactions should be detected and de-duplicated.
    {
        const auto submit_deduped = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                      package_parent_child, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_deduped{CheckPackageMempoolAcceptResult(package_parent_child, submit_deduped, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_deduped.value());
        } else {
            auto it_parent_deduped = submit_deduped.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child_deduped = submit_deduped.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}